

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O1

void __thiscall
VarnodeBank::VarnodeBank(VarnodeBank *this,AddrSpaceManager *m,AddrSpace *uspace,uintm ubase)

{
  _Rb_tree_header *p_Var1;
  Address local_30;
  
  p_Var1 = &(this->loc_tree)._M_t._M_impl.super__Rb_tree_header;
  (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->def_tree)._M_t._M_impl.super__Rb_tree_header;
  (this->def_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->def_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->def_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->def_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->def_tree)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Address::Address(&local_30,m_minimal);
  Varnode::Varnode(&this->searchvn,0,&local_30,(Datatype *)0x0);
  this->manage = m;
  (this->searchvn).flags = 8;
  this->uniq_space = uspace;
  this->uniqbase = ubase;
  this->uniqid = ubase;
  this->create_index = 0;
  return;
}

Assistant:

VarnodeBank::VarnodeBank(AddrSpaceManager *m,AddrSpace *uspace,uintm ubase)
  : searchvn(0,Address(Address::m_minimal),(Datatype *)0)

{
  manage = m;
  searchvn.flags = Varnode::input; // searchvn is always an input varnode of size 0
  uniq_space = uspace;
  uniqbase = ubase;
  uniqid = ubase;
  create_index = 0;
}